

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

Char __thiscall cppforth::Forth::dataSpaceAt(Forth *this,Cell index)

{
  reference pvVar1;
  pointer pVVar2;
  
  pVVar2 = (this->VirtualMemory).
           super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pVVar2 == (this->VirtualMemory).
                  super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return '\0';
    }
    if ((pVVar2->start <= index) && (index < pVVar2->end)) break;
    pVVar2 = pVVar2 + 1;
  }
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     (&pVVar2->segment,(ulong)(index - pVVar2->start));
  return *pvVar1;
}

Assistant:

Char dataSpaceAt(Cell index){
			for (auto it = VirtualMemory.begin(), itend=VirtualMemory.end(); it != itend ; ++it){
				if ((*it).start <= index && (*it).end > index){
					return (*it).segment.at(index - (*it).start);
				}
			}
			return Char(0); // all memory is filled by 0x00
		}